

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
          *value)

{
  bool bVar1;
  Serializer *in_RCX;
  undefined8 in_RDX;
  undefined2 in_SI;
  unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true> *in_RDI;
  
  if (((*(byte *)((long)&in_RDI[1].
                         super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
                         .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl + 1)
       & 1) == 0) &&
     (bVar1 = SerializationDefaultValue::
              IsDefault<duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
                        ((type *)0xaf2c74), bVar1)) {
    (*(code *)*(pointer *)
               ((long)&((in_RDI->
                        super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
                        .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl)->data
               + 0x10))(in_RDI,in_SI,in_RDX,0);
    (**(code **)&(in_RDI->
                 super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
                 .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl[1].
                 super_ParseInfo)(in_RDI,0);
  }
  else {
    (*(code *)*(pointer *)
               ((long)&((in_RDI->
                        super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
                        .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl)->data
               + 0x10))(in_RDI,in_SI,in_RDX,1);
    WriteValue<duckdb::BoundExportData>(in_RCX,in_RDI);
    (**(code **)&(in_RDI->
                 super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
                 .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl[1].
                 super_ParseInfo)(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}